

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O1

void __thiscall aalcalc::loadoccurrence(aalcalc *this)

{
  byte bVar1;
  FILE *__stream;
  mapped_type *pmVar2;
  char *pcVar3;
  byte bVar4;
  int date_opts;
  occurrence occ;
  int iStack_64;
  aalcalc *paStack_60;
  uint local_2c;
  occurrence_granular local_28;
  
  pcVar3 = "input/occurrence.bin";
  __stream = fopen("input/occurrence.bin","rb");
  if (__stream != (FILE *)0x0) {
    fread(&local_2c,4,1,__stream);
    if (local_2c < 2) {
      loadoccurrence<occurrence>(this,(occurrence *)&local_28,(FILE *)__stream);
    }
    else {
      loadoccurrence<occurrence_granular>(this,&local_28,(FILE *)__stream);
    }
    return;
  }
  loadoccurrence();
  paStack_60 = this;
  if ((pcVar3[0x220] == '\x01') && (1 < *(int *)(pcVar3 + 0x6c))) {
    bVar4 = 0;
    do {
      iStack_64 = 1 << (bVar4 & 0x1f);
      pmVar2 = std::
               map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
               ::operator[]((map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
                             *)(pcVar3 + 0x130),&iStack_64);
      std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>::resize
                (pmVar2,(long)*(int *)(pcVar3 + 400) + 1);
      bVar1 = bVar4 & 0x1f;
      bVar4 = bVar4 + 1;
    } while ((4 << bVar1) + -1 <= *(int *)(pcVar3 + 0x6c));
  }
  pmVar2 = std::
           map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
           ::operator[]((map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
                         *)(pcVar3 + 0x130),(key_type *)(pcVar3 + 0x6c));
  std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>::resize
            (pmVar2,(long)*(int *)(pcVar3 + 400) + 1);
  return;
}

Assistant:

void aalcalc::loadoccurrence()
{

	int date_opts;
	int granular_date = 0;
	FILE *fin = fopen(OCCURRENCE_FILE, "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, OCCURRENCE_FILE);
		exit(-1);
	}
	fread(&date_opts, sizeof(date_opts), 1, fin);
	granular_date = date_opts >> 1;
	if (granular_date) {
		occurrence_granular occ;
		loadoccurrence(occ, fin);
	} else {
		occurrence occ;
		loadoccurrence(occ, fin);
	}

}